

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O2

int __thiscall NetOptimize::fuse_innerproduct_batchnorm(NetOptimize *this)

{
  Mat *this_00;
  float fVar1;
  int iVar2;
  Layer *pLVar3;
  int *piVar4;
  pointer ppLVar5;
  Layer *pLVar6;
  pointer pMVar7;
  bool bVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  int j;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  float fVar17;
  ulong local_a8;
  vector<float,_std::allocator<float>_> b;
  vector<float,_std::allocator<float>_> a;
  Mat local_70;
  
  uVar13 = (long)(this->super_Net).layers.
                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->super_Net).layers.
                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_a8 = 1;
  uVar16 = 0;
  do {
    if (uVar16 == uVar13) {
      return 0;
    }
    bVar8 = std::operator!=(&(this->super_Net).layers.
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar16]->type,"InnerProduct");
    if (!bVar8) {
      iVar2 = *((this->super_Net).layers.
                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar16]->tops).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      for (uVar14 = local_a8; uVar14 < uVar13; uVar14 = uVar14 + 1) {
        bVar8 = std::operator!=(&(this->super_Net).layers.
                                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar14]->type,"BatchNorm")
        ;
        if (((!bVar8) &&
            (pLVar3 = (this->super_Net).layers.
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar14],
            piVar4 = (pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
            (long)*(pointer *)
                   ((long)&(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl +
                   8) - (long)piVar4 == 4)) && (*piVar4 == iVar2)) {
          if (uVar13 != uVar14) {
            ppLVar5 = (this->super_Net).layers.
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pLVar3 = ppLVar5[uVar16];
            pLVar6 = ppLVar5[uVar14];
            fprintf(_stderr,"fuse_innerproduct_batchnorm %s %s\n",(pLVar3->name)._M_dataplus._M_p);
            uVar9 = *(uint *)&pLVar6[1]._vptr_Layer;
            fVar1 = *(float *)((long)&pLVar6[1]._vptr_Layer + 4);
            std::vector<float,_std::allocator<float>_>::vector
                      (&a,(long)(int)uVar9,(allocator_type *)&local_70);
            std::vector<float,_std::allocator<float>_>::vector
                      (&b,(long)(int)uVar9,(allocator_type *)&local_70);
            uVar14 = 0;
            if (0 < (int)uVar9) {
              uVar14 = (ulong)uVar9;
            }
            for (uVar15 = 0; uVar14 != uVar15; uVar15 = uVar15 + 1) {
              fVar17 = *(float *)(*(long *)&pLVar6[1].bottom_shapes.
                                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                            ._M_impl.super__Vector_impl_data + uVar15 * 4) + fVar1;
              if (fVar17 < 0.0) {
                fVar17 = sqrtf(fVar17);
              }
              else {
                fVar17 = SQRT(fVar17);
              }
              lVar10 = *(long *)&pLVar6[1].one_blob_only;
              a.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar15] =
                   *(float *)(*(long *)&pLVar6[2].typeindex + uVar15 * 4) -
                   (*(float *)(lVar10 + uVar15 * 4) *
                   *(float *)(pLVar6[1].name.field_2._M_allocated_capacity + uVar15 * 4)) / fVar17;
              b.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar15] = *(float *)(lVar10 + uVar15 * 4) / fVar17;
            }
            if (*(int *)((long)&pLVar3[1]._vptr_Layer + 4) == 0) {
              *(undefined4 *)((long)&pLVar3[1]._vptr_Layer + 4) = 1;
              ncnn::Mat::Mat(&local_70,uVar9,4,(Allocator *)0x0);
              this_00 = (Mat *)((long)&pLVar3[1].bottom_shapes.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl + 0x10);
              ncnn::Mat::operator=(this_00,&local_70);
              ncnn::Mat::~Mat(&local_70);
              ncnn::Mat::fill(this_00,0.0);
            }
            uVar9 = *(int *)&pLVar3[1].one_blob_only / (int)uVar9;
            lVar10 = *(long *)&pLVar3[1].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data;
            pMVar7 = *(pointer *)
                      ((long)&pLVar3[1].bottom_shapes.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl +
                      0x10);
            uVar15 = 0;
            if (0 < (int)uVar9) {
              uVar15 = (ulong)uVar9;
            }
            for (uVar11 = 0; uVar11 != uVar14; uVar11 = uVar11 + 1) {
              for (uVar12 = 0; uVar15 != uVar12; uVar12 = uVar12 + 1) {
                *(float *)(lVar10 + uVar12 * 4) =
                     b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar11] * *(float *)(lVar10 + uVar12 * 4);
              }
              *(float *)((long)&pMVar7->data + uVar11 * 4) =
                   *(float *)((long)&pMVar7->data + uVar11 * 4) *
                   b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar11] +
                   a.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar11];
              lVar10 = lVar10 + (long)(int)uVar9 * 4;
            }
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                      (&b.super__Vector_base<float,_std::allocator<float>_>);
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                      (&a.super__Vector_base<float,_std::allocator<float>_>);
            iVar2 = *(pLVar6->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            *(pLVar3->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start = iVar2;
            (this->super_Net).blobs.super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
            _M_impl.super__Vector_impl_data._M_start[iVar2].producer = (int)uVar16;
            std::__cxx11::string::assign((char *)&pLVar6->type);
          }
          break;
        }
      }
    }
    uVar16 = uVar16 + 1;
    local_a8 = local_a8 + 1;
  } while( true );
}

Assistant:

int NetOptimize::fuse_innerproduct_batchnorm()
{
    const size_t layer_count = layers.size();
    for (int i=0; i<layer_count; i++)
    {
        if (layers[i]->type != "InnerProduct")
            continue;

        // InnerProduct - BatchNorm
        int top_blob_index = layers[i]->tops[0];

        int j = i + 1;
        for (; j<layer_count; j++)
        {
            if (layers[j]->type != "BatchNorm")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse InnerProduct - BatchNorm to InnerProduct
        ncnn::InnerProduct* innerproduct = (ncnn::InnerProduct*)layers[i];
        ncnn::BatchNorm* batchnorm = (ncnn::BatchNorm*)layers[j];

        fprintf(stderr, "fuse_innerproduct_batchnorm %s %s\n", innerproduct->name.c_str(), batchnorm->name.c_str());

        {
            int channels = batchnorm->channels;
            float eps = batchnorm->eps;

            // a = bias - slope * mean / sqrt(var + eps)
            // b = slope / sqrt(var + eps)
            // value = value * b + a

            std::vector<float> a(channels);
            std::vector<float> b(channels);
            for (int i=0; i<channels; i++)
            {
                float sqrt_var = static_cast<float>(sqrt(batchnorm->var_data[i] + eps));
                a[i] = batchnorm->bias_data[i] - batchnorm->slope_data[i] * batchnorm->mean_data[i] / sqrt_var;
                b[i] = batchnorm->slope_data[i] / sqrt_var;
            }

            if (innerproduct->bias_term == 0)
            {
                // init bias as zero
                innerproduct->bias_term = 1;
                innerproduct->bias_data = ncnn::Mat(channels);
                innerproduct->bias_data.fill(0.f);
            }

            const int weight_per_outch = innerproduct->weight_data_size / channels;

            float* weight = innerproduct->weight_data;
            float* bias = innerproduct->bias_data;
            for (int i=0; i<channels; i++)
            {
                float* conv_weight_outch = weight + weight_per_outch * i;
                for (int j=0; j<weight_per_outch; j++)
                {
                    conv_weight_outch[j] *= b[i];
                }

                bias[i] = bias[i] * b[i] + a[i];
            }
        }

        int top_blob_index_final = batchnorm->tops[0];
        innerproduct->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        batchnorm->type = "ncnnfused";
    }

    return 0;
}